

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pagerWalFrames(Pager *pPager,PgHdr *pList,Pgno nTruncate,int isCommit)

{
  byte bVar1;
  u32 uVar2;
  uint uVar3;
  Wal *pWal;
  u32 *puVar4;
  _func_int_sqlite3_file_ptr *p_Var5;
  bool bVar6;
  Pager *pPVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint *p;
  u32 uVar12;
  PgHdr **ppPVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  sqlite3_backup *p_00;
  uint uVar20;
  PgHdr *pPVar21;
  PgHdr *pPVar22;
  u32 uVar23;
  PgHdr *pPVar24;
  bool bVar25;
  u32 salt1;
  WalWriter w;
  uint local_c4;
  ulong local_a8;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  uint local_9c;
  undefined8 local_98;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  Pager *local_80;
  PgHdr *local_78;
  long local_70;
  sqlite3_file *local_68;
  uint *local_60;
  long local_58;
  WalWriter local_50;
  
  local_78 = pList;
  if (isCommit == 0) {
    iVar8 = 1;
  }
  else {
    iVar8 = 0;
    ppPVar13 = &local_78;
    do {
      if (pList->pgno <= nTruncate) {
        ppPVar13 = &pList->pDirty;
      }
      iVar8 = iVar8 + (uint)(pList->pgno <= nTruncate);
      pList = pList->pDirty;
      *ppPVar13 = pList;
    } while (pList != (PgHdr *)0x0);
  }
  pPVar22 = local_78;
  pPager->aStat[2] = pPager->aStat[2] + iVar8;
  if (local_78->pgno == 1) {
    pager_write_changecounter(local_78);
  }
  pWal = pPager->pWal;
  uVar2 = pPager->pageSize;
  bVar1 = pPager->walSyncFlags;
  puVar4 = *pWal->apWiData;
  iVar8 = bcmp(&pWal->hdr,puVar4,0x30);
  if (iVar8 == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = puVar4[4] + 1;
  }
  if (pWal->readLock == 0) {
    if (puVar4[0x18] == 0) {
LAB_00149958:
      if (pWal->exclusiveMode == '\0') {
        (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,5);
      }
      pWal->readLock = -1;
      iVar10 = 1;
      do {
        iVar8 = walTryBeginRead(pWal,(int *)&local_a8,1,iVar10);
        iVar10 = iVar10 + 1;
      } while (iVar8 == -1);
    }
    else {
      sqlite3_randomness(4,&local_a8);
      if (pWal->exclusiveMode != '\0') {
LAB_0014966e:
        walRestartHdr(pWal,(uint)local_a8);
        if (pWal->exclusiveMode == '\0') {
          (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,9);
        }
        goto LAB_00149958;
      }
      iVar8 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,10);
      if (iVar8 == 5) goto LAB_00149958;
      if (iVar8 == 0) goto LAB_0014966e;
    }
    if (iVar8 != 0) {
      return iVar8;
    }
  }
  local_c4 = (uint)bVar1;
  uVar20 = (pWal->hdr).mxFrame;
  uVar17 = (ulong)uVar20;
  if (uVar17 == 0) {
    local_a8 = 0x18e22d0082067f37;
    local_a0 = (char)(uVar2 >> 0x18);
    local_9f = (char)(uVar2 >> 0x10);
    local_9e = (char)(uVar2 >> 8);
    local_9d = (char)uVar2;
    uVar11 = pWal->nCkpt;
    local_9c = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
    if (uVar11 == 0) {
      sqlite3_randomness(8,(pWal->hdr).aSalt);
    }
    local_98 = *(undefined8 *)(pWal->hdr).aSalt;
    uVar23 = 0;
    uVar15 = 0xfffffffffffffff8;
    uVar12 = 0;
    do {
      uVar12 = uVar12 + uVar23 + *(int *)(&local_a0 + uVar15);
      uVar23 = uVar23 + *(int *)((long)&local_9c + uVar15) + uVar12;
      uVar15 = uVar15 + 8;
    } while (uVar15 < 0x10);
    local_90 = (undefined1)(uVar12 >> 0x18);
    local_8f = (undefined1)(uVar12 >> 0x10);
    local_8e = (undefined1)(uVar12 >> 8);
    local_8d = (undefined1)uVar12;
    local_8c = (undefined1)(uVar23 >> 0x18);
    local_8b = (undefined1)(uVar23 >> 0x10);
    local_8a = (undefined1)(uVar23 >> 8);
    local_89 = (undefined1)uVar23;
    pWal->szPage = uVar2;
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).aFrameCksum[0] = uVar12;
    (pWal->hdr).aFrameCksum[1] = uVar23;
    pWal->truncateOnCommit = '\x01';
    iVar8 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&local_a8,0x20,0);
    if (iVar8 != 0) {
      return iVar8;
    }
    if (((pWal->syncHeader != '\0') && ((bVar1 >> 2 & 3) != 0)) &&
       (iVar8 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,bVar1 >> 2 & 3), iVar8 != 0)) {
      return iVar8;
    }
  }
  local_68 = pWal->pWalFd;
  local_50.iSyncPoint = 0;
  lVar14 = (long)(int)uVar2 + 0x18;
  lVar18 = uVar17 * lVar14 + 0x20;
  iVar8 = 0;
  local_80 = pPager;
  local_50.pWal = pWal;
  local_50.pFd = local_68;
  local_50.syncFlags = (uint)bVar1;
  local_50.szPage = uVar2;
  if (pPVar22 == (PgHdr *)0x0) {
    pPVar21 = (PgHdr *)0x0;
  }
  else {
    pPVar21 = (PgHdr *)0x0;
    pPVar24 = pPVar22;
    do {
      if (uVar9 == 0) {
LAB_001495a8:
        if (isCommit == 0) {
          uVar15 = 0;
        }
        else {
          uVar15 = 0;
          if (pPVar24->pDirty == (PgHdr *)0x0) {
            uVar15 = (ulong)nTruncate;
          }
        }
LAB_001495c2:
        iVar10 = walWriteOneFrame(&local_50,(PgHdr *)pPVar24->pData,pPVar24->pgno,uVar15);
        if (iVar10 != 0) {
          return iVar10;
        }
        uVar17 = (ulong)((int)uVar17 + 1);
        lVar18 = lVar18 + lVar14;
        *(byte *)&pPVar24->flags = (byte)pPVar24->flags | 0x40;
        pPVar21 = pPVar24;
      }
      else {
        if ((isCommit != 0) && (uVar15 = (ulong)nTruncate, pPVar24->pDirty == (PgHdr *)0x0))
        goto LAB_001495c2;
        local_a8 = local_a8 & 0xffffffff00000000;
        sqlite3WalFindFrame(pWal,pPVar24->pgno,(u32 *)&local_a8);
        if ((uint)local_a8 < uVar9) goto LAB_001495a8;
        if ((uint)local_a8 <= pWal->iReCksum - 1) {
          pWal->iReCksum = (uint)local_a8;
        }
        iVar10 = (*pWal->pWalFd->pMethods->xWrite)
                           (pWal->pWalFd,pPVar24->pData,uVar2,
                            (ulong)((uint)local_a8 - 1) * lVar14 + 0x38);
        if (iVar10 != 0) {
          return iVar10;
        }
        *(byte *)&pPVar24->flags = (byte)pPVar24->flags & 0xbf;
      }
      uVar20 = (uint)uVar17;
      pPVar24 = pPVar24->pDirty;
    } while (pPVar24 != (PgHdr *)0x0);
  }
  uVar9 = 0;
  if (isCommit == 0) goto LAB_00149af7;
  if (pWal->iReCksum != 0) {
    lVar19 = (long)(int)pWal->szPage + 0x18;
    iVar8 = (int)lVar19;
    p = (uint *)sqlite3_malloc(iVar8);
    if (p == (uint *)0x0) {
      return 7;
    }
    lVar16 = 0x18;
    if (pWal->iReCksum != 1) {
      lVar16 = (ulong)(pWal->iReCksum - 2) * lVar19 + 0x30;
    }
    iVar10 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,8,lVar16);
    uVar9 = *p;
    (pWal->hdr).aFrameCksum[0] =
         uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    uVar9 = p[1];
    (pWal->hdr).aFrameCksum[1] =
         uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    uVar9 = pWal->iReCksum;
    pWal->iReCksum = 0;
    if (uVar20 < uVar9 || iVar10 != 0) {
      sqlite3_free(p);
    }
    else {
      local_58 = (long)iVar8;
      local_60 = p + 6;
      local_70 = lVar18;
      do {
        lVar18 = (ulong)(uVar9 - 1) * local_58 + 0x20;
        iVar10 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,iVar8,lVar18);
        if (iVar10 != 0) {
          sqlite3_free(p);
          return iVar10;
        }
        uVar11 = *p;
        uVar3 = p[1];
        walEncodeFrame(pWal,uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                            uVar11 << 0x18,
                       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18,(u8 *)local_60,(u8 *)&local_a8);
        iVar10 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&local_a8,0x18,lVar18);
      } while ((uVar9 + 1 <= uVar20) && (uVar9 = uVar9 + 1, iVar10 == 0));
      sqlite3_free(p);
      lVar18 = local_70;
    }
    if (iVar10 != 0) {
      return iVar10;
    }
  }
  if ((bVar1 & 3) == 0) {
    iVar8 = 0;
    uVar9 = 0;
  }
  else {
    if (pWal->padToSectorBoundary == '\0') {
      uVar9 = 0;
    }
    else {
      p_Var5 = pWal->pWalFd->pMethods->xSectorSize;
      if (p_Var5 == (_func_int_sqlite3_file_ptr *)0x0) {
        uVar17 = 0x1000;
      }
      else {
        uVar11 = (*p_Var5)(pWal->pWalFd);
        uVar9 = 0x10000;
        if (uVar11 < 0x10000) {
          uVar9 = uVar11;
        }
        uVar17 = 0x200;
        if (0x1f < (int)uVar11) {
          uVar17 = (ulong)uVar9;
        }
      }
      lVar16 = uVar17 + lVar18 + -1;
      lVar16 = lVar16 - lVar16 % (long)uVar17;
      iVar8 = 0;
      uVar9 = 0;
      local_50.iSyncPoint = lVar16;
      for (lVar19 = lVar18; lVar19 < lVar16; lVar19 = lVar19 + lVar14) {
        iVar10 = walWriteOneFrame(&local_50,(PgHdr *)pPVar21->pData,pPVar21->pgno,(ulong)nTruncate);
        if (iVar10 != 0) {
          return iVar10;
        }
        uVar9 = uVar9 + 1;
      }
      if (lVar16 != lVar18) goto LAB_00149abc;
    }
    iVar8 = (*local_68->pMethods->xSync)(local_68,local_c4 & 3);
  }
LAB_00149abc:
  if ((pWal->truncateOnCommit != '\0') && (lVar18 = pWal->mxWalSize, -1 < lVar18)) {
    lVar14 = (ulong)(uVar20 + uVar9) * lVar14 + 0x20;
    if (lVar14 <= lVar18) {
      lVar14 = lVar18;
    }
    walLimitSize(pWal,lVar14);
    pWal->truncateOnCommit = '\0';
  }
LAB_00149af7:
  uVar23 = (pWal->hdr).mxFrame;
  pPVar24 = pPVar22;
  while ((pPVar24 != (PgHdr *)0x0 && (iVar8 == 0))) {
    iVar8 = 0;
    if ((pPVar24->flags & 0x40) != 0) {
      uVar23 = uVar23 + 1;
      iVar8 = walIndexAppend(pWal,uVar23,pPVar24->pgno);
    }
    pPVar24 = pPVar24->pDirty;
  }
  bVar25 = iVar8 == 0;
  if ((bVar25) && (0 < (int)uVar9)) {
    do {
      uVar23 = uVar23 + 1;
      iVar8 = walIndexAppend(pWal,uVar23,pPVar21->pgno);
      bVar25 = iVar8 == 0;
      if (!bVar25) break;
      bVar6 = 1 < uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar6);
  }
  pPVar7 = local_80;
  if (bVar25) {
    (pWal->hdr).szPage = (ushort)(uVar2 >> 0x10) | (ushort)uVar2 & 0xff00;
    (pWal->hdr).mxFrame = uVar23;
    if (isCommit != 0) {
      puVar4 = &(pWal->hdr).iChange;
      *puVar4 = *puVar4 + 1;
      (pWal->hdr).nPage = nTruncate;
      walIndexWriteHdr(pWal);
      pWal->iCallback = uVar23;
    }
  }
  else if (iVar8 != 0) {
    return iVar8;
  }
  p_00 = pPVar7->pBackup;
  if (p_00 != (sqlite3_backup *)0x0 && pPVar22 != (PgHdr *)0x0) {
    while( true ) {
      if (p_00 != (sqlite3_backup *)0x0) {
        backupUpdate(p_00,pPVar22->pgno,(u8 *)pPVar22->pData);
      }
      pPVar22 = pPVar22->pDirty;
      if (pPVar22 == (PgHdr *)0x0) break;
      p_00 = pPVar7->pBackup;
    }
  }
  return 0;
}

Assistant:

static int pagerWalFrames(
  Pager *pPager,                  /* Pager object */
  PgHdr *pList,                   /* List of frames to log */
  Pgno nTruncate,                 /* Database size after this commit */
  int isCommit                    /* True if this is a commit */
){
  int rc;                         /* Return code */
  int nList;                      /* Number of pages in pList */
  PgHdr *p;                       /* For looping over pages */

  assert( pPager->pWal );
  assert( pList );
#ifdef SQLITE_DEBUG
  /* Verify that the page list is in accending order */
  for(p=pList; p && p->pDirty; p=p->pDirty){
    assert( p->pgno < p->pDirty->pgno );
  }
#endif

  assert( pList->pDirty==0 || isCommit );
  if( isCommit ){
    /* If a WAL transaction is being committed, there is no point in writing
    ** any pages with page numbers greater than nTruncate into the WAL file.
    ** They will never be read by any client. So remove them from the pDirty
    ** list here. */
    PgHdr **ppNext = &pList;
    nList = 0;
    for(p=pList; (*ppNext = p)!=0; p=p->pDirty){
      if( p->pgno<=nTruncate ){
        ppNext = &p->pDirty;
        nList++;
      }
    }
    assert( pList );
  }else{
    nList = 1;
  }
  pPager->aStat[PAGER_STAT_WRITE] += nList;

  if( pList->pgno==1 ) pager_write_changecounter(pList);
  rc = sqlite3WalFrames(pPager->pWal, 
      pPager->pageSize, pList, nTruncate, isCommit, pPager->walSyncFlags
  );
  if( rc==SQLITE_OK && pPager->pBackup ){
    for(p=pList; p; p=p->pDirty){
      sqlite3BackupUpdate(pPager->pBackup, p->pgno, (u8 *)p->pData);
    }
  }

#ifdef SQLITE_CHECK_PAGES
  pList = sqlite3PcacheDirtyList(pPager->pPCache);
  for(p=pList; p; p=p->pDirty){
    pager_set_pagehash(p);
  }
#endif

  return rc;
}